

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  ulong uVar1;
  int iVar2;
  Slice user_start;
  string tmp;
  Slice user_limit;
  pointer local_78;
  ulong local_70;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ulong local_40;
  char *local_38;
  long local_30;
  
  local_78 = (start->_M_dataplus)._M_p;
  uVar1 = start->_M_string_length - 8;
  local_38 = limit->data_;
  local_30 = limit->size_ - 8;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_70 = uVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,local_78,local_78 + (start->_M_string_length - 8));
  (*this->user_comparator_->_vptr_Comparator[4])(this->user_comparator_,&local_68,&local_38);
  if (local_68._M_string_length < uVar1) {
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68._M_dataplus._M_p;
    local_40 = local_68._M_string_length;
    iVar2 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_78);
    if (iVar2 < 0) {
      PutFixed64(&local_68,0xffffffffffffff01);
      std::__cxx11::string::swap((string *)start);
    }
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(std::string* start,
                                                  const Slice& limit) const {
  // Attempt to shorten the user portion of the key
  Slice user_start = ExtractUserKey(*start);
  Slice user_limit = ExtractUserKey(limit);
  std::string tmp(user_start.data(), user_start.size());
  user_comparator_->FindShortestSeparator(&tmp, user_limit);
  if (tmp.size() < user_start.size() &&
      user_comparator_->Compare(user_start, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*start, tmp) < 0);
    assert(this->Compare(tmp, limit) < 0);
    start->swap(tmp);
  }
}